

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstring.cpp
# Opt level: O3

qulonglong __thiscall
QString::toIntegral_helper(QString *this,QStringView string,bool *ok,uint base)

{
  uchar *dst;
  int base_00;
  size_t allocSize;
  long in_FS_OFFSET;
  QByteArrayView num;
  QSimpleParsedNumber<unsigned_long_long> QVar1;
  QString *local_150;
  uchar local_138 [256];
  long local_38;
  
  base_00 = (int)ok;
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(local_138,0xaa,0x100);
  local_150 = (QString *)0x100;
  dst = local_138;
  if (0x100 < (long)this) {
    local_150 = (QString *)QtPrivate::expectedAllocSize((size_t)this,0x10);
    if (local_150 == (QString *)0x0) {
      local_150 = this;
    }
    dst = (uchar *)malloc((size_t)local_150);
    if (dst == (uchar *)0x0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        qBadAlloc();
      }
      goto LAB_0032db84;
    }
  }
  qt_to_latin1(dst,(char16_t *)string.m_size,(qsizetype)this);
  num.m_data = (storage_type *)((ulong)ok & 0xffffffff);
  num.m_size = (qsizetype)dst;
  QVar1 = QLocaleData::bytearrayToUnsLongLong((QLocaleData *)this,num,base_00);
  if (string.m_data != (storage_type_conflict *)0x0) {
    *(bool *)string.m_data = 0 < QVar1.used;
  }
  if (dst != local_138) {
    QtPrivate::sizedFree(dst,(size_t)local_150);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return QVar1.result;
  }
LAB_0032db84:
  __stack_chk_fail();
}

Assistant:

qulonglong QString::toIntegral_helper(QStringView string, bool *ok, uint base)
{
    return toIntegral<qulonglong>(string, ok, base);
}